

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O3

void SplitTree(QuadTreeNode *Tree)

{
  Triangle *pTVar1;
  Container *pCVar2;
  Container **ppCVar3;
  Container *pCVar4;
  Container *pCVar5;
  Container *pCVar6;
  Container *pCVar7;
  uint uVar8;
  Container *pCVar9;
  long lVar10;
  bool bVar11;
  
  if (Tree->Children == (QuadTreeNode *)0x0) {
    pCVar5 = Tree->Contents;
    if (pCVar5 != (Container *)0x0) {
      Tree->Contents = (Container *)0x0;
      Tree->PostContents = (Container *)0x0;
      pCVar6 = (Container *)0x0;
      pCVar7 = (Container *)0x0;
      do {
        pTVar1 = (pCVar5->Content).T;
        if (pCVar5->Type == OBJECT) {
          uVar8 = *(uint *)(pTVar1->Edges + 1);
        }
        else {
          uVar8 = pTVar1->EdgeFlags[1] | pTVar1->EdgeFlags[0] | pTVar1->EdgeFlags[2];
        }
        bVar11 = (uVar8 >> 9 & 1) == 0;
        pCVar9 = pCVar7;
        if (bVar11) {
          pCVar9 = pCVar6;
        }
        pCVar2 = pCVar5->Next;
        ppCVar3 = &Tree->Contents;
        pCVar4 = pCVar5;
        if (!bVar11) {
          pCVar7 = pCVar5;
          ppCVar3 = &Tree->PostContents;
          pCVar4 = pCVar6;
        }
        pCVar6 = pCVar4;
        pCVar5->Next = pCVar9;
        *ppCVar3 = pCVar5;
        pCVar5 = pCVar2;
      } while (pCVar2 != (Container *)0x0);
    }
  }
  else {
    lVar10 = 0xd8;
    do {
      SplitTree((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar10));
      lVar10 = lVar10 + -0x48;
    } while (lVar10 != -0x48);
  }
  return;
}

Assistant:

void SplitTree(struct QuadTreeNode *Tree)
{
   struct Container *P, *PNext;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         SplitTree(&Tree->Children[c]);
   } else if (Tree->Contents) {
      P = Tree->Contents;
      Tree->Contents = Tree->PostContents = NULL;

      while (P) {
         PNext = P->Next;

         if (P->Type == OBJECT) {
            if (P->Content.O->Flags & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         } else {
            if ((P->Content.T->EdgeFlags[0] | P->Content.T->
                 EdgeFlags[1] | P->Content.T->EdgeFlags[2])
                & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         }

         P = PNext;
      }
   }
}